

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_instructions.c
# Opt level: O0

uint8_t implied_BRK(cpu_registers *registers)

{
  uint8_t BRK_special_flags;
  cpu_registers *registers_local;
  
  push_PC_onto_stack(registers,registers->PC + 1);
  push_stack(registers,registers->flags | 0x30);
  load_IRQ_vector_into_PC(registers);
  set_cpu_flag(registers,'\x04');
  return '\0';
}

Assistant:

uint8_t implied_BRK(cpu_registers* registers) {
    // BRK sets these two bits for some reason
    uint8_t BRK_special_flags = 0x30;
    // Pushes PC + 2 from instruction fetch for some reason
    push_PC_onto_stack(registers, registers->PC + 1);
    push_stack(registers, registers->flags | BRK_special_flags);
    load_IRQ_vector_into_PC(registers);
    set_cpu_flag(registers, INTERRUPT_FLAG);
    return ZERO_EXTRA_CYCLES;
}